

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  mbedtls_key_exchange_type_t mVar2;
  uint uVar3;
  uint uVar4;
  mbedtls_ssl_ciphersuite_t *ciphersuite;
  uchar *puVar5;
  size_t __n;
  mbedtls_x509_crt *pmVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  mbedtls_x509_crt *pmVar10;
  mbedtls_x509_crl **ppmVar11;
  mbedtls_ecp_group_id *pmVar12;
  ushort uVar13;
  mbedtls_ecp_group_id mVar14;
  long lVar15;
  mbedtls_ssl_config *pmVar16;
  char *pcVar17;
  mbedtls_ssl_session *pmVar18;
  ulong uVar19;
  
  ciphersuite = ssl->transform_negotiate->ciphersuite_info;
  uVar1 = *(uint *)&ssl->conf->field_0x174;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x107f,"=> parse certificate");
  mVar2 = ciphersuite->key_exchange;
  if ((mVar2 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
     ((0x960U >> (mVar2 & 0x1f) & 1) != 0)) {
    iVar7 = 0x1086;
LAB_00115546:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar7,"<= skip parse certificate");
    ssl->state = ssl->state + 1;
    return 0;
  }
  uVar3 = *(uint *)&ssl->conf->field_0x174;
  if (mVar2 == MBEDTLS_KEY_EXCHANGE_RSA_PSK && (uVar3 & 1) != 0) {
    iVar7 = 0x108f;
    goto LAB_00115546;
  }
  uVar4 = ssl->handshake->sni_authmode;
  uVar1 = uVar1 >> 2 & 3;
  if (uVar4 != 3) {
    uVar1 = uVar4;
  }
  if (((uVar3 & 1) != 0) && (uVar1 == 0)) {
    ssl->session_negotiate->verify_result = 0x80;
    iVar7 = 0x109d;
    goto LAB_00115546;
  }
  iVar7 = mbedtls_ssl_read_record(ssl);
  if (iVar7 != 0) {
    pcVar17 = "mbedtls_ssl_read_record";
    iVar8 = 0x10a5;
LAB_00115610:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar8,pcVar17,iVar7);
    return iVar7;
  }
  ssl->state = ssl->state + 1;
  uVar3 = *(uint *)&ssl->conf->field_0x174;
  if ((((((uVar3 & 1) != 0) && (ssl->minor_ver != 0)) &&
       (uVar9 = (ulong)((uVar3 & 2) << 2), ssl->in_hslen == uVar9 + 7)) &&
      ((ssl->in_msgtype == 0x16 && (puVar5 = ssl->in_msg, *puVar5 == '\v')))) &&
     (uVar9 = uVar9 | 4, puVar5[uVar9 + 2] == '\0' && *(short *)(puVar5 + uVar9) == 0)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x10cd,"TLSv1 client has no certificate");
    ssl->session_negotiate->verify_result = 0x40;
    if (uVar1 != 1) {
      return -0x7480;
    }
    return 0;
  }
  if (ssl->in_msgtype != 0x16) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x10dc,"bad certificate message");
    return -0x7700;
  }
  puVar5 = ssl->in_msg;
  if (*puVar5 == '\v') {
    uVar9 = (ulong)((uVar3 & 2) << 2);
    if (uVar9 + 10 <= ssl->in_hslen) {
      uVar19 = uVar9 | 4;
      if ((puVar5[uVar19] == '\0') &&
         (ssl->in_hslen ==
          (ushort)(*(ushort *)(puVar5 + uVar19 + 1) << 8 | *(ushort *)(puVar5 + uVar19 + 1) >> 8) +
          uVar19 + 3)) {
        pmVar18 = ssl->session_negotiate;
        if (pmVar18->peer_cert != (mbedtls_x509_crt *)0x0) {
          mbedtls_x509_crt_free(pmVar18->peer_cert);
          free(ssl->session_negotiate->peer_cert);
          pmVar18 = ssl->session_negotiate;
        }
        pmVar10 = (mbedtls_x509_crt *)calloc(1,0x228);
        pmVar18->peer_cert = pmVar10;
        if (pmVar10 == (mbedtls_x509_crt *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x1100,"alloc(%d bytes) failed",0x228);
          return -0x7f00;
        }
        uVar9 = uVar9 | 7;
        mbedtls_x509_crt_init(pmVar10);
        iVar7 = 0;
        uVar19 = ssl->in_hslen;
        while (uVar9 < uVar19) {
          puVar5 = ssl->in_msg;
          if (puVar5[uVar9] != '\0') {
            pcVar17 = "bad certificate message";
            iVar7 = 0x110c;
            goto LAB_001157fa;
          }
          uVar13 = *(ushort *)(puVar5 + uVar9 + 1) << 8 | *(ushort *)(puVar5 + uVar9 + 1) >> 8;
          if (uVar13 < 0x80) {
LAB_00115937:
            pcVar17 = "bad certificate message";
            iVar7 = 0x1116;
            goto LAB_001157fa;
          }
          lVar15 = uVar9 + 3;
          uVar9 = (ulong)uVar13 + lVar15;
          if (uVar19 < uVar9) goto LAB_00115937;
          iVar7 = mbedtls_x509_crt_parse_der
                            (ssl->session_negotiate->peer_cert,puVar5 + lVar15,(ulong)uVar13);
          if ((iVar7 != -0x262e) && (iVar7 != 0)) {
            pcVar17 = " mbedtls_x509_crt_parse_der";
            iVar8 = 0x111e;
            goto LAB_00115610;
          }
          uVar19 = ssl->in_hslen;
        }
        mbedtls_debug_print_crt
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x1125,"peer certificate",ssl->session_negotiate->peer_cert);
        pmVar16 = ssl->conf;
        if (((pmVar16->field_0x174 & 1) != 0) || (ssl->renego_status != 1)) {
LAB_00115916:
          if (uVar1 != 0) {
            pmVar10 = ssl->handshake->sni_ca_chain;
            if (pmVar10 == (mbedtls_x509_crt *)0x0) {
              pmVar10 = pmVar16->ca_chain;
              if (pmVar10 == (mbedtls_x509_crt *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x1155,"got no CA chain");
                return -0x7680;
              }
              ppmVar11 = &pmVar16->ca_crl;
            }
            else {
              ppmVar11 = &ssl->handshake->sni_ca_crl;
            }
            iVar8 = mbedtls_x509_crt_verify_with_profile
                              (ssl->session_negotiate->peer_cert,pmVar10,*ppmVar11,
                               pmVar16->cert_profile,ssl->hostname,
                               &ssl->session_negotiate->verify_result,pmVar16->f_vrfy,
                               pmVar16->p_vrfy);
            if (iVar8 != 0) {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x1166,"x509_verify_cert",iVar8);
            }
            pmVar10 = ssl->session_negotiate->peer_cert;
            iVar7 = mbedtls_pk_can_do(&pmVar10->pk,MBEDTLS_PK_ECKEY);
            pmVar16 = ssl->conf;
            if (iVar7 != 0) {
              pmVar12 = pmVar16->curve_list;
              if ((pmVar12 != (mbedtls_ecp_group_id *)0x0) &&
                 (mVar14 = *pmVar12, mVar14 != MBEDTLS_ECP_DP_NONE)) {
                do {
                  pmVar12 = pmVar12 + 1;
                  if (mVar14 == *(pmVar10->pk).pk_ctx) goto LAB_00115a61;
                  mVar14 = *pmVar12;
                } while (mVar14 != MBEDTLS_ECP_DP_NONE);
              }
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x1175,"bad certificate (EC key curve)");
              if (iVar8 == 0) {
                iVar8 = -0x7a00;
              }
              pmVar16 = ssl->conf;
            }
LAB_00115a61:
            iVar7 = mbedtls_ssl_check_cert_usage
                              (ssl->session_negotiate->peer_cert,ciphersuite,
                               ~*(uint *)&pmVar16->field_0x174 & 1,
                               &ssl->session_negotiate->verify_result);
            if ((iVar7 != 0) &&
               (mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x1181,"bad certificate (usage extensions)"), iVar8 == 0)) {
              iVar8 = -0x7a00;
            }
            iVar7 = 0;
            if (uVar1 != 1) {
              iVar7 = iVar8;
            }
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x118a,"<= parse certificate");
          return iVar7;
        }
        pmVar10 = ssl->session->peer_cert;
        if (pmVar10 == (mbedtls_x509_crt *)0x0) {
          pcVar17 = "new server cert during renegotiation";
          iVar7 = 0x1131;
        }
        else {
          __n = (pmVar10->raw).len;
          pmVar6 = ssl->session_negotiate->peer_cert;
          if ((__n == (pmVar6->raw).len) &&
             (iVar8 = bcmp((pmVar10->raw).p,(pmVar6->raw).p,__n), iVar8 == 0)) goto LAB_00115916;
          pcVar17 = "server cert changed during renegotiation";
          iVar7 = 0x113b;
        }
      }
      else {
        pcVar17 = "bad certificate message";
        iVar7 = 0x10f1;
      }
      goto LAB_001157fa;
    }
  }
  pcVar17 = "bad certificate message";
  iVar7 = 0x10e3;
LAB_001157fa:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,iVar7,pcVar17);
  return -0x7a00;
}

Assistant:

int mbedtls_ssl_parse_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    int authmode = ssl->conf->authmode;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
#endif

    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_SKIP_VERIFY;
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }
#endif

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    ssl->state++;

#if defined(MBEDTLS_SSL_SRV_C)
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    /*
     * Check if the client sent an empty certificate
     */
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_msglen  == 2                        &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT            &&
            ssl->in_msg[0]  == MBEDTLS_SSL_ALERT_LEVEL_WARNING  &&
            ssl->in_msg[1]  == MBEDTLS_SSL_ALERT_MSG_NO_CERT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "SSLv3 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_hslen   == 3 + mbedtls_ssl_hs_hdr_len( ssl ) &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE    &&
            ssl->in_msg[0]  == MBEDTLS_SSL_HS_CERTIFICATE   &&
            memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ), "\0\0\0", 3 ) == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLSv1 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
#endif /* MBEDTLS_SSL_SRV_C */

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE ||
        ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 3 + 3 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     * Same message structure as in mbedtls_ssl_write_certificate()
     */
    n = ( ssl->in_msg[i+1] << 8 ) | ssl->in_msg[i+2];

    if( ssl->in_msg[i] != 0 ||
        ssl->in_hslen != n + 3 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    /* In case we tried to reuse a session but it failed */
    if( ssl->session_negotiate->peer_cert != NULL )
    {
        mbedtls_x509_crt_free( ssl->session_negotiate->peer_cert );
        mbedtls_free( ssl->session_negotiate->peer_cert );
    }

    if( ( ssl->session_negotiate->peer_cert = mbedtls_calloc( 1,
                    sizeof( mbedtls_x509_crt ) ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                       sizeof( mbedtls_x509_crt ) ) );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    mbedtls_x509_crt_init( ssl->session_negotiate->peer_cert );

    i += 3;

    while( i < ssl->in_hslen )
    {
        if( ssl->in_msg[i] != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        n = ( (unsigned int) ssl->in_msg[i + 1] << 8 )
            | (unsigned int) ssl->in_msg[i + 2];
        i += 3;

        if( n < 128 || i + n > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        ret = mbedtls_x509_crt_parse_der( ssl->session_negotiate->peer_cert,
                                  ssl->in_msg + i, n );
        if( 0 != ret && ( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG + MBEDTLS_ERR_OID_NOT_FOUND ) != ret )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, " mbedtls_x509_crt_parse_der", ret );
            return( ret );
        }

        i += n;
    }

    MBEDTLS_SSL_DEBUG_CRT( 3, "peer certificate", ssl->session_negotiate->peer_cert );

    /*
     * On client, make sure the server cert doesn't change during renego to
     * avoid "triple handshake" attack: https://secure-resumption.com/
     */
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        if( ssl->session->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "new server cert during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        if( ssl->session->peer_cert->raw.len !=
            ssl->session_negotiate->peer_cert->raw.len ||
            memcmp( ssl->session->peer_cert->raw.p,
                    ssl->session_negotiate->peer_cert->raw.p,
                    ssl->session->peer_cert->raw.len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "server cert changed during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_RENEGOTIATION && MBEDTLS_SSL_CLI_C */

    if( authmode != MBEDTLS_SSL_VERIFY_NONE )
    {
        mbedtls_x509_crt *ca_chain;
        mbedtls_x509_crl *ca_crl;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
        if( ssl->handshake->sni_ca_chain != NULL )
        {
            ca_chain = ssl->handshake->sni_ca_chain;
            ca_crl   = ssl->handshake->sni_ca_crl;
        }
        else
#endif
        {
            ca_chain = ssl->conf->ca_chain;
            ca_crl   = ssl->conf->ca_crl;
        }

        if( ca_chain == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no CA chain" ) );
            return( MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED );
        }

        /*
         * Main check: verify certificate
         */
        ret = mbedtls_x509_crt_verify_with_profile(
                                ssl->session_negotiate->peer_cert,
                                ca_chain, ca_crl,
                                ssl->conf->cert_profile,
                                ssl->hostname,
                               &ssl->session_negotiate->verify_result,
                                ssl->conf->f_vrfy, ssl->conf->p_vrfy );

        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "x509_verify_cert", ret );
        }

        /*
         * Secondary checks: always done, but change 'ret' only if it was 0
         */

#if defined(MBEDTLS_ECP_C)
        {
            const mbedtls_pk_context *pk = &ssl->session_negotiate->peer_cert->pk;

            /* If certificate uses an EC key, make sure the curve is OK */
            if( mbedtls_pk_can_do( pk, MBEDTLS_PK_ECKEY ) &&
                mbedtls_ssl_check_curve( ssl, mbedtls_pk_ec( *pk )->grp.id ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (EC key curve)" ) );
                if( ret == 0 )
                    ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
            }
        }
#endif /* MBEDTLS_ECP_C */

        if( mbedtls_ssl_check_cert_usage( ssl->session_negotiate->peer_cert,
                                  ciphersuite_info,
                                  ! ssl->conf->endpoint,
                                 &ssl->session_negotiate->verify_result ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (usage extensions)" ) );
            if( ret == 0 )
                ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
        }

        if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
            ret = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate" ) );

    return( ret );
}